

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeDeclaration_Tag.cpp
# Opt level: O0

void __thiscall
psy::C::TagDeclarationSymbol::TagDeclarationSymbol
          (TagDeclarationSymbol *this,SymbolKind symK,Symbol *containingSym,SyntaxTree *tree,
          Scope *enclosingScope,TagType *tagTy)

{
  TypeDeclarationImpl *this_00;
  TagType *tagTy_local;
  Scope *enclosingScope_local;
  SyntaxTree *tree_local;
  Symbol *containingSym_local;
  SymbolKind symK_local;
  TagDeclarationSymbol *this_local;
  
  this_00 = (TypeDeclarationImpl *)operator_new(0x30);
  TypeDeclarationSymbol::TypeDeclarationImpl::TypeDeclarationImpl
            (this_00,symK,containingSym,tree,enclosingScope,Tags,&tagTy->super_Type);
  TypeDeclarationSymbol::TypeDeclarationSymbol(&this->super_TypeDeclarationSymbol,this_00);
  (this->super_TypeDeclarationSymbol).super_DeclarationSymbol.super_Symbol._vptr_Symbol =
       (_func_int **)&PTR__TagDeclarationSymbol_00734178;
  std::
  vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
  ::vector(&this->membDecls_);
  TagType::setDeclaration(tagTy,this);
  return;
}

Assistant:

TagDeclarationSymbol::TagDeclarationSymbol(
        SymbolKind symK,
        const Symbol* containingSym,
        const SyntaxTree* tree,
        const Scope* enclosingScope,
        TagType* tagTy)
    : TypeDeclarationSymbol(
          new TypeDeclarationImpl(symK,
                                  containingSym,
                                  tree,
                                  enclosingScope,
                                  NameSpace::Tags,
                                  tagTy))
{
    tagTy->setDeclaration(this);
}